

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t create_filesystem_object(archive_write_disk *a)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *path;
  wchar_t *pwVar7;
  dev_t dVar8;
  wchar_t local_ec;
  wchar_t local_e8;
  wchar_t local_e4;
  undefined1 auStack_e0 [4];
  wchar_t error_number;
  archive_string error_string;
  stat_conflict st;
  char *linkname_copy;
  uint local_28;
  wchar_t r;
  mode_t mode;
  mode_t final_mode;
  char *linkname;
  archive_write_disk *a_local;
  
  pcVar6 = archive_entry_hardlink(a->entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_symlink(a->entry);
    if (pcVar6 == (char *)0x0) {
      uVar3 = a->mode & 0xfff;
      uVar4 = uVar3 & ~a->user_umask;
      local_28 = uVar4 & 0x1ff;
      uVar5 = a->mode & 0xf000;
      if (uVar5 == 0x1000) {
        linkname_copy._4_4_ = mkfifo(a->name,local_28);
      }
      else if (uVar5 == 0x2000) {
        pcVar6 = a->name;
        dVar8 = archive_entry_rdev(a->entry);
        linkname_copy._4_4_ = mknod(pcVar6,local_28 | 0x2000,dVar8);
      }
      else if (uVar5 == 0x4000) {
        local_28 = uVar4 & 0x1fd | 0x1c0;
        linkname_copy._4_4_ = mkdir(a->name,local_28);
        if (linkname_copy._4_4_ == 0) {
          a->deferred = a->todo & 4U | a->deferred;
          a->todo = a->todo & 0xfffffffb;
          if ((local_28 != uVar3) || ((a->flags & 2U) != 0)) {
            a->deferred = a->todo & 0x34000000U | a->deferred;
          }
          a->todo = a->todo & 0xcbffffff;
        }
      }
      else if (uVar5 == 0x6000) {
        pcVar6 = a->name;
        dVar8 = archive_entry_rdev(a->entry);
        linkname_copy._4_4_ = mknod(pcVar6,local_28 | 0x6000,dVar8);
      }
      else {
        wVar1 = open(a->name,0x800c1,(ulong)local_28);
        a->fd = wVar1;
        __archive_ensure_cloexec_flag(a->fd);
        linkname_copy._4_4_ = (wchar_t)(a->fd < L'\0');
      }
      if (linkname_copy._4_4_ == 0) {
        if (local_28 == uVar3) {
          a->todo = a->todo & 0xcbffffff;
        }
        a_local._4_4_ = L'\0';
      }
      else {
        pwVar7 = __errno_location();
        a_local._4_4_ = *pwVar7;
      }
    }
    else {
      iVar2 = symlink(pcVar6,a->name);
      if (iVar2 == 0) {
        local_ec = L'\0';
      }
      else {
        pwVar7 = __errno_location();
        local_ec = *pwVar7;
      }
      a_local._4_4_ = local_ec;
    }
  }
  else {
    _auStack_e0 = (char *)0x0;
    error_string.s = (char *)0x0;
    error_string.length = 0;
    path = strdup(pcVar6);
    if (path == (char *)0x0) {
      a_local._4_4_ = L'\x01';
    }
    else {
      wVar1 = cleanup_pathname_fsobj(path,&local_e4,(archive_string *)auStack_e0,a->flags);
      if (wVar1 == L'\0') {
        wVar1 = check_symlinks_fsobj(path,&local_e4,(archive_string *)auStack_e0,a->flags);
        if (wVar1 == L'\0') {
          free(path);
          archive_string_free((archive_string *)auStack_e0);
          iVar2 = link(pcVar6,a->name);
          if (iVar2 == 0) {
            local_e8 = L'\0';
          }
          else {
            pwVar7 = __errno_location();
            local_e8 = *pwVar7;
          }
          linkname_copy._4_4_ = local_e8;
          if ((local_e8 == L'\0') && (a->filesize < 1)) {
            a->todo = L'\0';
            a->deferred = L'\0';
          }
          else if ((local_e8 == L'\0') && (0 < a->filesize)) {
            iVar2 = lstat(a->name,(stat *)&error_string.buffer_length);
            if (iVar2 == 0) {
              linkname_copy._4_4_ = L'\0';
              if (((uint)st.st_nlink & 0xf000) == 0x8000) {
                wVar1 = open(a->name,0xa0201);
                a->fd = wVar1;
                __archive_ensure_cloexec_flag(a->fd);
                if (a->fd < L'\0') {
                  pwVar7 = __errno_location();
                  linkname_copy._4_4_ = *pwVar7;
                }
              }
            }
            else {
              pwVar7 = __errno_location();
              linkname_copy._4_4_ = *pwVar7;
            }
          }
          a_local._4_4_ = linkname_copy._4_4_;
        }
        else {
          archive_set_error(&a->archive,local_e4,"%s",_auStack_e0);
          free(path);
          archive_string_free((archive_string *)auStack_e0);
          a_local._4_4_ = L'\x01';
        }
      }
      else {
        archive_set_error(&a->archive,local_e4,"%s",_auStack_e0);
        free(path);
        archive_string_free((archive_string *)auStack_e0);
        a_local._4_4_ = L'\x01';
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
create_filesystem_object(struct archive_write_disk *a)
{
	/* Create the entry. */
	const char *linkname;
	mode_t final_mode, mode;
	int r;
	/* these for check_symlinks_fsobj */
	char *linkname_copy;	/* non-const copy of linkname */
	struct stat st;
	struct archive_string error_string;
	int error_number;

	/* We identify hard/symlinks according to the link names. */
	/* Since link(2) and symlink(2) don't handle modes, we're done here. */
	linkname = archive_entry_hardlink(a->entry);
	if (linkname != NULL) {
#if !HAVE_LINK
		return (EPERM);
#else
		archive_string_init(&error_string);
		linkname_copy = strdup(linkname);
		if (linkname_copy == NULL) {
		    return (EPERM);
		}
		/*
		 * TODO: consider using the cleaned-up path as the link
		 * target?
		 */
		r = cleanup_pathname_fsobj(linkname_copy, &error_number,
		    &error_string, a->flags);
		if (r != ARCHIVE_OK) {
			archive_set_error(&a->archive, error_number, "%s",
			    error_string.s);
			free(linkname_copy);
			archive_string_free(&error_string);
			/*
			 * EPERM is more appropriate than error_number for our
			 * callers
			 */
			return (EPERM);
		}
		r = check_symlinks_fsobj(linkname_copy, &error_number,
		    &error_string, a->flags);
		if (r != ARCHIVE_OK) {
			archive_set_error(&a->archive, error_number, "%s",
			    error_string.s);
			free(linkname_copy);
			archive_string_free(&error_string);
			/*
			 * EPERM is more appropriate than error_number for our
			 * callers
			 */
			return (EPERM);
		}
		free(linkname_copy);
		archive_string_free(&error_string);
		r = link(linkname, a->name) ? errno : 0;
		/*
		 * New cpio and pax formats allow hardlink entries
		 * to carry data, so we may have to open the file
		 * for hardlink entries.
		 *
		 * If the hardlink was successfully created and
		 * the archive doesn't have carry data for it,
		 * consider it to be non-authoritative for meta data.
		 * This is consistent with GNU tar and BSD pax.
		 * If the hardlink does carry data, let the last
		 * archive entry decide ownership.
		 */
		if (r == 0 && a->filesize <= 0) {
			a->todo = 0;
			a->deferred = 0;
		} else if (r == 0 && a->filesize > 0) {
#ifdef HAVE_LSTAT
			r = lstat(a->name, &st);
#else
			r = stat(a->name, &st);
#endif
			if (r != 0)
				r = errno;
			else if ((st.st_mode & AE_IFMT) == AE_IFREG) {
				a->fd = open(a->name, O_WRONLY | O_TRUNC |
				    O_BINARY | O_CLOEXEC | O_NOFOLLOW);
				__archive_ensure_cloexec_flag(a->fd);
				if (a->fd < 0)
					r = errno;
			}
		}
		return (r);
#endif
	}
	linkname = archive_entry_symlink(a->entry);
	if (linkname != NULL) {
#if HAVE_SYMLINK
		return symlink(linkname, a->name) ? errno : 0;
#else
		return (EPERM);
#endif
	}

	/*
	 * The remaining system calls all set permissions, so let's
	 * try to take advantage of that to avoid an extra chmod()
	 * call.  (Recall that umask is set to zero right now!)
	 */

	/* Mode we want for the final restored object (w/o file type bits). */
	final_mode = a->mode & 07777;
	/*
	 * The mode that will actually be restored in this step.  Note
	 * that SUID, SGID, etc, require additional work to ensure
	 * security, so we never restore them at this point.
	 */
	mode = final_mode & 0777 & ~a->user_umask;

	switch (a->mode & AE_IFMT) {
	default:
		/* POSIX requires that we fall through here. */
		/* FALLTHROUGH */
	case AE_IFREG:
		a->fd = open(a->name,
		    O_WRONLY | O_CREAT | O_EXCL | O_BINARY | O_CLOEXEC, mode);
		__archive_ensure_cloexec_flag(a->fd);
		r = (a->fd < 0);
		break;
	case AE_IFCHR:
#ifdef HAVE_MKNOD
		/* Note: we use AE_IFCHR for the case label, and
		 * S_IFCHR for the mknod() call.  This is correct.  */
		r = mknod(a->name, mode | S_IFCHR,
		    archive_entry_rdev(a->entry));
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a char device node. */
		return (EINVAL);
#endif /* HAVE_MKNOD */
	case AE_IFBLK:
#ifdef HAVE_MKNOD
		r = mknod(a->name, mode | S_IFBLK,
		    archive_entry_rdev(a->entry));
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a block device node. */
		return (EINVAL);
#endif /* HAVE_MKNOD */
	case AE_IFDIR:
		mode = (mode | MINIMUM_DIR_MODE) & MAXIMUM_DIR_MODE;
		r = mkdir(a->name, mode);
		if (r == 0) {
			/* Defer setting dir times. */
			a->deferred |= (a->todo & TODO_TIMES);
			a->todo &= ~TODO_TIMES;
			/* Never use an immediate chmod(). */
			/* We can't avoid the chmod() entirely if EXTRACT_PERM
			 * because of SysV SGID inheritance. */
			if ((mode != final_mode)
			    || (a->flags & ARCHIVE_EXTRACT_PERM))
				a->deferred |= (a->todo & TODO_MODE);
			a->todo &= ~TODO_MODE;
		}
		break;
	case AE_IFIFO:
#ifdef HAVE_MKFIFO
		r = mkfifo(a->name, mode);
		break;
#else
		/* TODO: Find a better way to warn about our inability
		 * to restore a fifo. */
		return (EINVAL);
#endif /* HAVE_MKFIFO */
	}

	/* All the system calls above set errno on failure. */
	if (r)
		return (errno);

	/* If we managed to set the final mode, we've avoided a chmod(). */
	if (mode == final_mode)
		a->todo &= ~TODO_MODE;
	return (0);
}